

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void test_align_down(void)

{
  ulong alignment_00;
  size_t sVar1;
  size_t r;
  size_t size;
  size_t alignment;
  int i;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","test_align_down");
  alignment._4_4_ = 0;
  do {
    if (5 < alignment._4_4_) {
      _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/util.c"
          ,0xa1,"line %d");
      _space(_stdout);
      printf("# *** %s: done ***\n","test_align_down");
      check_plan();
      return;
    }
    alignment_00 = (ulong)(1 << ((byte)alignment._4_4_ & 0x1f));
    for (r = 0; r < 0x75; r = r + 1) {
      sVar1 = small_align_down(r,alignment_00);
      if (sVar1 % alignment_00 != 0) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","r % alignment == 0",
                "false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/util.c",
                0x9c,"test_align_down");
        exit(-1);
      }
      if (r < sVar1) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","r <= size","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/util.c",
                0x9d,"test_align_down");
        exit(-1);
      }
      if (alignment_00 <= r - sVar1) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "size - r < alignment","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/util.c",
                0x9e,"test_align_down");
        exit(-1);
      }
    }
    alignment._4_4_ = alignment._4_4_ + 1;
  } while( true );
}

Assistant:

static void
test_align_down(void)
{
	plan(1);
	header();

	for (int i = 0; i < 6; i++) {
		size_t alignment = 1 << i;
		for (size_t size = 0; size < 117; size++) {
			size_t r = small_align_down(size, alignment);
			fail_unless(r % alignment == 0);
			fail_unless(r <= size);
			fail_unless(size - r < alignment);
		}
	}
	ok(true);

	footer();
	check_plan();
}